

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_func_jit(jit_State *J,TraceNo lnk)

{
  uint64_t uVar1;
  GCtrace *T;
  TraceNo lnk_local;
  jit_State *J_local;
  
  rec_func_setup(J);
  uVar1 = J->trace[lnk].gcptr64;
  if (*(char *)(uVar1 + 0x74) == '\a') {
    check_call_unroll(J,lnk);
    J->patchins = *J->pc;
    J->patchpc = J->pc;
    *J->patchpc = *(BCIns *)(uVar1 + 0x50);
  }
  else {
    J->instunroll = 0;
    if ((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
      lj_record_stop(J,LJ_TRLINK_TAILREC,(uint)(J->cur).traceno);
    }
    else {
      lj_record_stop(J,LJ_TRLINK_ROOT,lnk);
    }
  }
  return;
}

Assistant:

static void rec_func_jit(jit_State *J, TraceNo lnk)
{
  GCtrace *T;
  rec_func_setup(J);
  T = traceref(J, lnk);
  if (T->linktype == LJ_TRLINK_RETURN) {  /* Trace returns to interpreter? */
    check_call_unroll(J, lnk);
    /* Temporarily unpatch JFUNC* to continue recording across function. */
    J->patchins = *J->pc;
    J->patchpc = (BCIns *)J->pc;
    *J->patchpc = T->startins;
    return;
  }
  J->instunroll = 0;  /* Cannot continue across a compiled function. */
  if (J->pc == J->startpc && J->framedepth + J->retdepth == 0)
    lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Extra tail-rec. */
  else
    lj_record_stop(J, LJ_TRLINK_ROOT, lnk);  /* Link to the function. */
}